

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O2

bool common::FeeModeFromString(string *mode_string,FeeEstimateMode *fee_estimate_mode)

{
  pointer ppVar1;
  __type_conflict _Var2;
  pointer ppVar3;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string searchkey;
  string sStack_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (mode_string->_M_dataplus)._M_p;
  str._M_len = mode_string->_M_string_length;
  ToUpper_abi_cxx11_(&local_58,str);
  FeeModeMap_abi_cxx11_();
  ppVar1 = FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = FeeModeMap[abi:cxx11]()::FEE_MODES_abi_cxx11_.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FeeEstimateMode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar3 == ppVar1) {
LAB_00a61bc6:
      std::__cxx11::string::~string((string *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return ppVar3 != ppVar1;
      }
      __stack_chk_fail();
    }
    str_00._M_str = (ppVar3->first)._M_dataplus._M_p;
    str_00._M_len = (ppVar3->first)._M_string_length;
    ToUpper_abi_cxx11_(&sStack_78,str_00);
    _Var2 = std::operator==(&sStack_78,&local_58);
    std::__cxx11::string::~string((string *)&sStack_78);
    if (_Var2) {
      *fee_estimate_mode = ppVar3->second;
      goto LAB_00a61bc6;
    }
    ppVar3 = ppVar3 + 1;
  } while( true );
}

Assistant:

bool FeeModeFromString(const std::string& mode_string, FeeEstimateMode& fee_estimate_mode)
{
    auto searchkey = ToUpper(mode_string);
    for (const auto& pair : FeeModeMap()) {
        if (ToUpper(pair.first) == searchkey) {
            fee_estimate_mode = pair.second;
            return true;
        }
    }
    return false;
}